

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O3

int Sbm_ManCreateCnf(Sbm_Man_t *p)

{
  uint uVar1;
  sat_solver *psVar2;
  Vec_Int_t *pVVar3;
  lit *begin;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong in_RAX;
  long lVar7;
  long lVar8;
  Vec_Wec_t *pVVar9;
  uint uVar10;
  Vec_Int_t *in_RSI;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int Lits [2];
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar5 = Sbm_ManCheckSol(p,in_RSI);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = p->FirstVar;
    iVar6 = sat_solver_nvars(p->pSat);
    if (iVar5 != iVar6) {
      __assert_fail("p->FirstVar == sat_solver_nvars(p->pSat)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                    ,0x9d,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
    }
    psVar2 = p->pSat;
    iVar5 = sat_solver_nvars(psVar2);
    sat_solver_setnvars(psVar2,iVar5 + p->vCuts->nSize);
    pVVar9 = p->vObjCuts;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      uVar13 = 0;
      lVar12 = 0;
      do {
        pVVar3 = pVVar9->pArray;
        lVar7 = (long)*(int *)((long)&pVVar3->nSize + lVar11);
        if (lVar7 < 2) {
          __assert_fail("Vec_IntSize(vLits) >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                        ,0xa3,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
        }
        begin = *(lit **)((long)&pVVar3->pArray + lVar11);
        iVar5 = sat_solver_addclause(p->pSat,begin,begin + lVar7);
        if (iVar5 == 0) {
          __assert_fail("value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                        ,0xa5,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
        }
        lVar7 = (long)&pVVar3->nCap + lVar11;
        if ((uVar13 & 1) != 0) {
          lVar8 = (long)*(int *)(lVar7 + 4);
          if (lVar8 < 1) {
LAB_007b29e7:
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
          }
          iVar5 = *(int *)(*(long *)((long)&pVVar3->pArray + lVar11) + -4 + lVar8 * 4);
          if (iVar5 < 0) {
LAB_007b29c8:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          local_38 = CONCAT44(local_38._4_4_,iVar5) ^ 1;
          if ((long)*(int *)(lVar12 + 4) < 1) goto LAB_007b29e7;
          iVar5 = *(int *)(*(long *)(lVar12 + 8) + -4 + (long)*(int *)(lVar12 + 4) * 4);
          if (iVar5 < 0) goto LAB_007b29c8;
          local_38 = CONCAT44(iVar5,(lit)local_38) ^ 0x100000000;
          iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0);
          if (iVar5 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,0xba,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
        }
        uVar13 = uVar13 + 1;
        pVVar9 = p->vObjCuts;
        lVar11 = lVar11 + 0x10;
        lVar12 = lVar7;
      } while ((long)uVar13 < (long)pVVar9->nSize);
    }
    pVVar9 = p->vCuts;
    if (0 < pVVar9->nSize) {
      lVar12 = 0;
      do {
        pVVar3 = pVVar9->pArray;
        if (0 < pVVar3[lVar12].nSize) {
          lVar11 = 0;
          do {
            uVar1 = pVVar3[lVar12].pArray[lVar11];
            if ((int)uVar1 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar10 = uVar1 >> 1;
            if (p->nInputs < (int)uVar10) {
              iVar5 = uVar1 - p->LitShift;
              if (iVar5 < 0) {
LAB_007b290e:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              iVar5 = iVar5 * 2;
              local_38 = CONCAT44(local_38._4_4_,iVar5);
              iVar6 = p->FirstVar + (int)lVar12;
              if (iVar6 < 0) goto LAB_007b290e;
              local_38 = CONCAT44(iVar6 * 2 + 1,iVar5);
              iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0)
              ;
              if (iVar5 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                              ,0xcf,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
              }
            }
            else {
              if (lVar11 == 0) {
                __assert_fail("k > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                              ,0xc4,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
              }
              piVar4 = &p->vObjCuts->nSize;
              iVar5 = uVar10 + *piVar4;
              if (iVar5 == 0 || SCARRY4(uVar10,*piVar4) != iVar5 < 0) goto LAB_007b290e;
              iVar5 = iVar5 * 2 + -2;
              local_38 = CONCAT44(local_38._4_4_,iVar5);
              iVar6 = p->FirstVar + (int)lVar12;
              if (iVar6 < 0) goto LAB_007b290e;
              local_38 = CONCAT44(iVar6 * 2 + 1,iVar5);
              iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0)
              ;
              if (iVar5 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                              ,200,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar3[lVar12].nSize);
          pVVar9 = p->vCuts;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar9->nSize);
    }
    psVar2 = p->pSat;
    piVar4 = p->vPolar->pArray;
    uVar1 = p->vPolar->nSize;
    if (0 < psVar2->size) {
      lVar12 = 0;
      do {
        psVar2->polarity[lVar12] = '\0';
        lVar12 = lVar12 + 1;
      } while (lVar12 < psVar2->size);
    }
    iVar5 = 1;
    if (0 < (int)uVar1) {
      uVar13 = 0;
      do {
        psVar2->polarity[piVar4[uVar13]] = '\x01';
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
    }
  }
  return iVar5;
}

Assistant:

int Sbm_ManCreateCnf( Sbm_Man_t * p )
{
    int i, k, Lit, Lits[2], value;
    Vec_Int_t * vLits, * vCutOne, * vLitsPrev;
    // sat_solver_rollback( p->Sat );
    if ( !Sbm_ManCheckSol(p, p->vSolCuts) )
        return 0;
    // increase var count
    assert( p->FirstVar == sat_solver_nvars(p->pSat) );
    sat_solver_setnvars( p->pSat, sat_solver_nvars(p->pSat) + Vec_WecSize(p->vCuts) );
    // iterate over arrays containing obj-lit cuts (neg-obj-lit cut-lits followed by pos-obj-lit cut-lits)
    vLitsPrev = NULL;
    Vec_WecForEachLevel( p->vObjCuts, vLits, i )
    {
        assert( Vec_IntSize(vLits) >= 2 );
        value = sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits)  );
        assert( value );
/*
        // for each cut, add implied nodes
        Lits[0] = Abc_LitNot( Vec_IntEntry(vLits, 0) );
        assert( Lits[0] < 2*p->FirstVar );
        Vec_IntForEachEntryStart( vLits, Lit, k, 1 )
        {
            assert( Lit >= 2*p->FirstVar );
            Lits[1] = Abc_LitNot( Lit );
            value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
            assert( value );
            //printf( "Adding clause %d + %d.\n", Lits[0], Lits[1]-2*p->FirstVar );
        }
*/
        //printf( "\n" );
        // create invertor exclusivity clause
        if ( i & 1 )
        {
            Lits[0] = Abc_LitNot( Vec_IntEntryLast(vLits) );
            Lits[1] = Abc_LitNot( Vec_IntEntryLast(vLitsPrev) );
            value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
            assert( value );
            //printf( "Adding exclusivity clause %d + %d.\n", Lits[0]-2*p->FirstVar, Lits[1]-2*p->FirstVar );
        }
        vLitsPrev = vLits;
    }
    // add inverters
    Vec_WecForEachLevel( p->vCuts, vCutOne, i )
        Vec_IntForEachEntry( vCutOne, Lit, k )
            if ( Abc_Lit2Var(Lit)-1 < p->nInputs ) // input
            {
                assert( k > 0 );
                Lits[0] = Abc_Var2Lit( Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1, 0 );
                Lits[1] = Abc_Var2Lit( p->FirstVar + i, 1 );
                value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
                assert( value );
            }
            else // internal node
            {
                Lits[0] = Abc_Var2Lit( Lit-p->LitShift, 0 );
                Lits[1] = Abc_Var2Lit( p->FirstVar + i, 1 );
                value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
                assert( value );
            }

    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolar), Vec_IntSize(p->vPolar) );
    return 1;
}